

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_Writer.cpp
# Opt level: O2

void __thiscall OSTEI_Writer::WriteAccumulation(OSTEI_Writer *this)

{
  QAM *pQVar1;
  int iVar2;
  OSTEI_HRR_Algorithm_Base *this_00;
  ostream *poVar3;
  _Base_ptr p_Var4;
  QAMSet topq;
  string local_130;
  _Rb_tree<QAM,_QAM,_std::_Identity<QAM>,_std::less<QAM>,_std::allocator<QAM>_> local_110;
  string local_e0;
  undefined1 local_c0 [48];
  undefined1 local_90 [48];
  undefined1 local_60 [48];
  
  this_00 = OSTEI_HRR_Writer::Algo((this->super_OSTEI_Writer_Base).hrr_writer_);
  OSTEI_HRR_Algorithm_Base::TopAM((QAMSet *)&local_110,this_00);
  std::operator<<((this->super_OSTEI_Writer_Base).os_,"\n\n");
  poVar3 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent5_abi_cxx11_);
  std::operator<<(poVar3,"////////////////////////////////////\n");
  poVar3 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent5_abi_cxx11_);
  std::operator<<(poVar3,"// Accumulate contracted integrals\n");
  poVar3 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent5_abi_cxx11_);
  std::operator<<(poVar3,"////////////////////////////////////\n");
  poVar3 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent5_abi_cxx11_);
  std::operator<<(poVar3,"if(lastoffset == 0)\n");
  poVar3 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent5_abi_cxx11_);
  std::operator<<(poVar3,"{\n");
  for (p_Var4 = local_110._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != &local_110._M_impl.super__Rb_tree_header;
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
    pQVar1 = (QAM *)(p_Var4 + 1);
    QAM::QAM((QAM *)local_c0,pQVar1);
    iVar2 = NCART((QAM *)local_c0);
    std::__cxx11::string::~string((string *)(local_c0 + 0x10));
    poVar3 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent6_abi_cxx11_);
    poVar3 = std::operator<<(poVar3,"contract_all(");
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,iVar2);
    poVar3 = std::operator<<(poVar3,", ");
    PrimVarName_abi_cxx11_(&local_130,pQVar1);
    poVar3 = std::operator<<(poVar3,(string *)&local_130);
    poVar3 = std::operator<<(poVar3,", ");
    PrimPtrName_abi_cxx11_(&local_e0,pQVar1);
    poVar3 = std::operator<<(poVar3,(string *)&local_e0);
    std::operator<<(poVar3,");\n");
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_130);
  }
  poVar3 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent5_abi_cxx11_);
  std::operator<<(poVar3,"}\n");
  poVar3 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent5_abi_cxx11_);
  std::operator<<(poVar3,"else\n");
  poVar3 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent5_abi_cxx11_);
  std::operator<<(poVar3,"{\n");
  for (p_Var4 = local_110._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != &local_110._M_impl.super__Rb_tree_header;
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
    pQVar1 = (QAM *)(p_Var4 + 1);
    QAM::QAM((QAM *)local_60,pQVar1);
    iVar2 = NCART((QAM *)local_60);
    std::__cxx11::string::~string((string *)(local_60 + 0x10));
    poVar3 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent6_abi_cxx11_);
    poVar3 = std::operator<<(poVar3,"contract(");
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,iVar2);
    poVar3 = std::operator<<(poVar3,", shelloffsets, ");
    PrimVarName_abi_cxx11_(&local_130,pQVar1);
    poVar3 = std::operator<<(poVar3,(string *)&local_130);
    poVar3 = std::operator<<(poVar3,", ");
    PrimPtrName_abi_cxx11_(&local_e0,pQVar1);
    poVar3 = std::operator<<(poVar3,(string *)&local_e0);
    std::operator<<(poVar3,");\n");
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_130);
  }
  for (p_Var4 = local_110._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != &local_110._M_impl.super__Rb_tree_header;
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
    poVar3 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent6_abi_cxx11_);
    PrimPtrName_abi_cxx11_(&local_130,(QAM *)(p_Var4 + 1));
    poVar3 = std::operator<<(poVar3,(string *)&local_130);
    poVar3 = std::operator<<(poVar3," += lastoffset*");
    QAM::QAM((QAM *)local_90,(QAM *)(p_Var4 + 1));
    iVar2 = NCART((QAM *)local_90);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,iVar2);
    std::operator<<(poVar3,";\n");
    std::__cxx11::string::~string((string *)(local_90 + 0x10));
    std::__cxx11::string::~string((string *)&local_130);
  }
  poVar3 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent5_abi_cxx11_);
  std::operator<<(poVar3,"}\n");
  std::_Rb_tree<QAM,_QAM,_std::_Identity<QAM>,_std::less<QAM>,_std::allocator<QAM>_>::~_Rb_tree
            (&local_110);
  return;
}

Assistant:

void OSTEI_Writer::WriteAccumulation(void) const
{
    const auto topq = hrr_writer_.Algo().TopAM();

    os_ << "\n\n";
    os_ << indent5 << "////////////////////////////////////\n";
    os_ << indent5 << "// Accumulate contracted integrals\n";
    os_ << indent5 << "////////////////////////////////////\n";

    os_ << indent5 << "if(lastoffset == 0)\n";
    os_ << indent5 << "{\n";

    for(const auto &it : topq)
    {
        int ncart = NCART(it);
        os_ << indent6 << "contract_all(" << ncart << ", " << PrimVarName(it) << ", " << PrimPtrName(it) << ");\n";
    }

    os_ << indent5 << "}\n";
    os_ << indent5 << "else\n";
    os_ << indent5 << "{\n";

    for(const auto &it : topq)
    {
        int ncart = NCART(it);
        os_ << indent6 << "contract(" << ncart << ", shelloffsets, " << PrimVarName(it) << ", " << PrimPtrName(it) << ");\n";
    }

    for(const auto &it : topq)
        os_ << indent6 << PrimPtrName(it) << " += lastoffset*" << NCART(it) << ";\n";

    os_ << indent5 << "}\n";
}